

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatawidgetmapper.cpp
# Opt level: O2

void QDataWidgetMapper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  SubmitPolicy *pSVar4;
  code *UNRECOVERED_JUMPTABLE;
  SubmitPolicy SVar5;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      currentIndexChanged((QDataWidgetMapper *)_o,*_a[1]);
      return;
    case 1:
      revert((QDataWidgetMapper *)_o);
      return;
    case 2:
      bVar2 = submit((QDataWidgetMapper *)_o);
      if (*_a != (void *)0x0) {
        *(bool *)*_a = bVar2;
      }
      break;
    case 3:
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x60);
      SVar5 = AutoSubmit;
      goto LAB_0050fb32;
    case 4:
      toLast((QDataWidgetMapper *)_o);
      return;
    case 5:
      toNext((QDataWidgetMapper *)_o);
      return;
    case 6:
      toPrevious((QDataWidgetMapper *)_o);
      return;
    case 7:
      pSVar4 = (SubmitPolicy *)_a[1];
      goto LAB_0050fb29;
    case 8:
      setCurrentModelIndex((QDataWidgetMapper *)_o,(QModelIndex *)_a[1]);
      return;
    }
    break;
  case ReadProperty:
    piVar1 = (int *)*_a;
    if (_id == 2) {
      iVar3 = *(int *)(*(long *)(_o + 8) + 0x8c);
    }
    else if (_id == 1) {
      iVar3 = *(int *)(*(long *)(_o + 8) + 0x88);
    }
    else {
      if (_id != 0) {
        return;
      }
      iVar3 = currentIndex((QDataWidgetMapper *)_o);
    }
    *piVar1 = iVar3;
    break;
  case WriteProperty:
    pSVar4 = (SubmitPolicy *)*_a;
    if (_id == 2) {
      setSubmitPolicy((QDataWidgetMapper *)_o,*pSVar4);
      return;
    }
    if (_id == 1) {
      setOrientation((QDataWidgetMapper *)_o,*pSVar4);
      return;
    }
    if (_id != 0) {
      return;
    }
LAB_0050fb29:
    SVar5 = *pSVar4;
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)_o + 0x60);
LAB_0050fb32:
    (*UNRECOVERED_JUMPTABLE)(_o,SVar5);
    return;
  case IndexOfMethod:
    QtMocHelpers::indexOfMethod<void(QDataWidgetMapper::*)(int)>
              ((QtMocHelpers *)_a,(void **)currentIndexChanged,0,0);
    return;
  }
  return;
}

Assistant:

void QDataWidgetMapper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDataWidgetMapper *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->revert(); break;
        case 2: { bool _r = _t->submit();
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 3: _t->toFirst(); break;
        case 4: _t->toLast(); break;
        case 5: _t->toNext(); break;
        case 6: _t->toPrevious(); break;
        case 7: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->setCurrentModelIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDataWidgetMapper::*)(int )>(_a, &QDataWidgetMapper::currentIndexChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 2: *reinterpret_cast<SubmitPolicy*>(_v) = _t->submitPolicy(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 2: _t->setSubmitPolicy(*reinterpret_cast<SubmitPolicy*>(_v)); break;
        default: break;
        }
    }
}